

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<std::pair<double,unsigned_long>>
          (Serializer *this,
          priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
          *queue)

{
  unsigned_long uVar1;
  vector<std::pair<double,_unsigned_long>,_true> placeholder;
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  queue_copy;
  vector<std::pair<double,_unsigned_long>,_true> local_58;
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  local_38;
  
  local_58.
  super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<double,_unsigned_long> *)0x0;
  local_58.
  super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_unsigned_long> *)0x0;
  ::std::
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>::
  vector(&local_38.c,&queue->c);
  while (local_38.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_38.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start) {
    if (local_58.
        super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        .
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        .
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
      ::_M_realloc_insert<std::pair<double,unsigned_long>const&>
                ((vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
                  *)&local_58,
                 (iterator)
                 local_58.
                 super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_38.c.
                 super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      uVar1 = (local_38.c.
               super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
      (local_58.
       super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
       .
       super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->first =
           (local_38.c.
            super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first;
      (local_58.
       super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
       .
       super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->second = uVar1;
      local_58.
      super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      .
      super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           .
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::pop(&local_38);
  }
  WriteValue<std::pair<double,unsigned_long>>(this,&local_58);
  if (local_38.c.
      super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<double,_unsigned_long> *)0x0) {
    operator_delete(local_38.c.
                    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.
      super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      .
      super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteValue(const std::priority_queue<T> &queue) {
		vector<T> placeholder;
		auto queue_copy = std::priority_queue<T>(queue);
		while (queue_copy.size() > 0) {
			placeholder.emplace_back(queue_copy.top());
			queue_copy.pop();
		}
		WriteValue(placeholder);
	}